

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::Pooling3DLayerParams::_InternalSerialize
          (Pooling3DLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  Pooling3DLayerParams_PoolingType3D PVar2;
  int32_t iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  int size;
  uint8_t *puVar5;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Pooling3DLayerParams *this_local;
  
  PVar2 = _internal_type(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (PVar2 != Pooling3DLayerParams_PoolingType3D_MAX) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    PVar2 = _internal_type(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,PVar2,puVar5);
  }
  iVar3 = _internal_kerneldepth(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_kerneldepth(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,iVar3,puVar5);
  }
  iVar3 = _internal_kernelheight(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_kernelheight(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,iVar3,puVar5);
  }
  iVar3 = _internal_kernelwidth(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_kernelwidth(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,iVar3,puVar5);
  }
  iVar3 = _internal_stridedepth(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_stridedepth(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5,iVar3,puVar5);
  }
  iVar3 = _internal_strideheight(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_strideheight(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6,iVar3,puVar5);
  }
  iVar3 = _internal_stridewidth(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_stridewidth(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingfront(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingfront(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(8,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingback(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingback(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(9,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingtop(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingtop(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(10,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingbottom(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingbottom(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0xb,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingleft(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingleft(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0xc,iVar3,puVar5);
  }
  iVar3 = _internal_custompaddingright(this);
  if (iVar3 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar3 = _internal_custompaddingright(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0xd,iVar3,puVar5);
  }
  bVar1 = _internal_countexcludepadding(this);
  if (bVar1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_countexcludepadding(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(0xe,bVar1,puVar5);
  }
  PVar4 = _internal_paddingtype(this);
  if (PVar4 != Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    PVar4 = _internal_paddingtype(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xf,PVar4,puVar5);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* Pooling3DLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Pooling3DLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->_internal_type() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_type(), target);
  }

  // int32 kernelDepth = 2;
  if (this->_internal_kerneldepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_kerneldepth(), target);
  }

  // int32 kernelHeight = 3;
  if (this->_internal_kernelheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_kernelheight(), target);
  }

  // int32 kernelWidth = 4;
  if (this->_internal_kernelwidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_kernelwidth(), target);
  }

  // int32 strideDepth = 5;
  if (this->_internal_stridedepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(5, this->_internal_stridedepth(), target);
  }

  // int32 strideHeight = 6;
  if (this->_internal_strideheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(6, this->_internal_strideheight(), target);
  }

  // int32 strideWidth = 7;
  if (this->_internal_stridewidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_stridewidth(), target);
  }

  // int32 customPaddingFront = 8;
  if (this->_internal_custompaddingfront() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(8, this->_internal_custompaddingfront(), target);
  }

  // int32 customPaddingBack = 9;
  if (this->_internal_custompaddingback() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_custompaddingback(), target);
  }

  // int32 customPaddingTop = 10;
  if (this->_internal_custompaddingtop() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_custompaddingtop(), target);
  }

  // int32 customPaddingBottom = 11;
  if (this->_internal_custompaddingbottom() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_custompaddingbottom(), target);
  }

  // int32 customPaddingLeft = 12;
  if (this->_internal_custompaddingleft() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(12, this->_internal_custompaddingleft(), target);
  }

  // int32 customPaddingRight = 13;
  if (this->_internal_custompaddingright() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(13, this->_internal_custompaddingright(), target);
  }

  // bool countExcludePadding = 14;
  if (this->_internal_countexcludepadding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_countexcludepadding(), target);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->_internal_paddingtype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      15, this->_internal_paddingtype(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Pooling3DLayerParams)
  return target;
}